

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcBlendEquationAdvancedTests.cpp
# Opt level: O0

void __thiscall
glcts::BlendTestCaseGroup::BlendTest::getTestColors(BlendTest *this,int index,Vec4 *src,Vec4 *dst)

{
  GLfloat *pf_00;
  RenderTarget *a;
  Vec4 *a_00;
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  PixelFormat *pf_01;
  undefined8 local_f0;
  undefined8 local_e8;
  Vector<float,_4> local_e0;
  Vector<float,_4> local_d0;
  undefined8 local_c0;
  undefined8 local_b8;
  Vector<float,_4> local_b0;
  Vector<float,_4> local_a0;
  undefined8 local_90;
  undefined8 local_88;
  Vector<float,_4> local_80;
  undefined8 local_70;
  undefined8 local_68;
  Vector<float,_4> local_60;
  undefined8 local_50;
  undefined8 local_48;
  float *local_40;
  GLfloat *s;
  PixelFormat *pf;
  RenderTarget *rt;
  Vec4 *dst_local;
  Vec4 *src_local;
  BlendTest *pBStack_10;
  int index_local;
  BlendTest *this_local;
  
  rt = (RenderTarget *)dst;
  dst_local = src;
  src_local._4_4_ = index;
  pBStack_10 = this;
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[4])();
  pf = (PixelFormat *)CONCAT44(extraout_var,iVar1);
  pf_01 = tcu::RenderTarget::getPixelFormat((RenderTarget *)pf);
  local_40 = this->m_colors + (src_local._4_4_ << 3);
  s = (GLfloat *)pf_01;
  tcu::Vector<float,_4>::Vector(&local_60,*local_40,local_40[1],local_40[2],local_40[3]);
  MaskChannels((glcts *)&local_50,pf_01,&local_60);
  pf_00 = s;
  *(undefined8 *)dst_local->m_data = local_50;
  *(undefined8 *)(dst_local->m_data + 2) = local_48;
  tcu::Vector<float,_4>::Vector(&local_80,local_40[4],local_40[5],local_40[6],local_40[7]);
  MaskChannels((glcts *)&local_70,(PixelFormat *)pf_00,&local_80);
  a_00 = dst_local;
  rt->m_width = (undefined4)local_70;
  rt->m_height = local_70._4_4_;
  (rt->m_pixelFormat).redBits = (undefined4)local_68;
  (rt->m_pixelFormat).greenBits = local_68._4_4_;
  tcu::Vector<float,_4>::Vector(&local_a0,0.0);
  tcu::Vector<float,_4>::Vector(&local_b0,1.0);
  tcu::clamp<float,4>((tcu *)&local_90,a_00,&local_a0,&local_b0);
  a = rt;
  *(undefined8 *)dst_local->m_data = local_90;
  *(undefined8 *)(dst_local->m_data + 2) = local_88;
  tcu::Vector<float,_4>::Vector(&local_d0,0.0);
  tcu::Vector<float,_4>::Vector(&local_e0,1.0);
  tcu::clamp<float,4>((tcu *)&local_c0,(Vector<float,_4> *)a,&local_d0,&local_e0);
  rt->m_width = (undefined4)local_c0;
  rt->m_height = local_c0._4_4_;
  (rt->m_pixelFormat).redBits = (undefined4)local_b8;
  (rt->m_pixelFormat).greenBits = local_b8._4_4_;
  QuantizeChannels((glcts *)&local_f0,(PixelFormat *)s,(Vec4 *)rt);
  rt->m_width = (undefined4)local_f0;
  rt->m_height = local_f0._4_4_;
  (rt->m_pixelFormat).redBits = (undefined4)local_e8;
  (rt->m_pixelFormat).greenBits = local_e8._4_4_;
  return;
}

Assistant:

void BlendTestCaseGroup::BlendTest::getTestColors(int index, tcu::Vec4& src, tcu::Vec4& dst) const
{
	DE_ASSERT(0 <= index && index < m_numColors);

	const tcu::RenderTarget& rt = m_context.getRenderContext().getRenderTarget();
	const tcu::PixelFormat&  pf = rt.getPixelFormat();
	const glw::GLfloat*		 s  = m_colors + 8 * index;

	src = MaskChannels(pf, tcu::Vec4(s[0], s[1], s[2], s[3]));
	dst = MaskChannels(pf, tcu::Vec4(s[4], s[5], s[6], s[7]));
	src = tcu::clamp(src, tcu::Vec4(0.f), tcu::Vec4(1.f));
	dst = tcu::clamp(dst, tcu::Vec4(0.f), tcu::Vec4(1.f));

	// Quantize the destination channels
	// this matches what implementation does on render target write
	dst = QuantizeChannels(pf, dst);
}